

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  reference pvVar4;
  uint local_b0;
  allocator local_a9;
  uint32_t data_len;
  size_t local_88;
  size_t type_len;
  allocator local_69;
  string local_68 [32];
  size_t local_48;
  size_t name_len;
  size_t size_local;
  char *marker_local;
  size_t *marker_size_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  string *type_local;
  string *name_local;
  
  name_len = size;
  size_local = (size_t)marker;
  marker_local = (char *)marker_size;
  marker_size_local = (size_t *)data;
  data_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)type;
  type_local = name;
  sVar3 = strnlen(marker,size);
  sVar1 = size_local;
  if (sVar3 == name_len) {
    name_local._7_1_ = false;
  }
  else {
    local_48 = sVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,(char *)sVar1,sVar3,&local_69);
    std::__cxx11::string::operator=((string *)type_local,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    size_local = local_48 + 1 + size_local;
    name_len = name_len - (local_48 + 1);
    sVar3 = strnlen((char *)size_local,name_len);
    sVar1 = size_local;
    if (sVar3 == name_len) {
      name_local._7_1_ = false;
    }
    else {
      local_88 = sVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&data_len,(char *)sVar1,sVar3,&local_a9);
      std::__cxx11::string::operator=((string *)data_local,(string *)&data_len);
      std::__cxx11::string::~string((string *)&data_len);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      size_local = local_88 + 1 + size_local;
      name_len = name_len - (local_88 + 1);
      if (name_len < 4) {
        name_local._7_1_ = false;
      }
      else {
        local_b0 = *(uint *)size_local;
        swap4(&local_b0);
        if (local_b0 == 0) {
          iVar2 = std::__cxx11::string::compare((char *)data_local);
          if (iVar2 == 0) {
            size_local = size_local + 4;
            name_len = name_len - 4;
            *(size_t *)marker_local = local_48 + local_88 + 6;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)marker_size_local,1)
            ;
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                marker_size_local,0);
            *pvVar4 = '\0';
            name_local._7_1_ = true;
          }
          else {
            name_local._7_1_ = false;
          }
        }
        else {
          size_local = size_local + 4;
          name_len = name_len - 4;
          if (name_len < local_b0) {
            name_local._7_1_ = false;
          }
          else {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)marker_size_local,
                       (ulong)local_b0);
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                marker_size_local,0);
            memcpy(pvVar4,(void *)size_local,(ulong)local_b0);
            *(size_t *)marker_local = local_48 + local_88 + 6 + (ulong)local_b0;
            name_local._7_1_ = true;
          }
        }
      }
    }
  }
  return name_local._7_1_;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}